

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O3

float Gia_ManDelayTraceLut(Gia_Man_t *p)

{
  void *pvVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  Vec_Flt_t *pVVar6;
  float *pfVar7;
  Vec_Int_t *pVVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  undefined8 uVar14;
  Tim_Man_t *p_00;
  int iVar15;
  ulong uVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float local_34;
  
  pvVar1 = p->pLutLib;
  if ((pvVar1 != (void *)0x0) &&
     (iVar11 = *(int *)((long)pvVar1 + 8), iVar4 = Gia_ManLutSizeMax(p), iVar11 < iVar4)) {
    uVar10 = *(uint *)((long)pvVar1 + 8);
    uVar5 = Gia_ManLutSizeMax(p);
    printf("The max LUT size (%d) is less than the max fanin count (%d).\n",(ulong)uVar10,
           (ulong)uVar5);
    return -1e+09;
  }
  if (p->vTiming != (Vec_Flt_t *)0x0) {
    __assert_fail("p->vTiming == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x26c,"void Gia_ManTimeStart(Gia_Man_t *)");
  }
  pVVar6 = (Vec_Flt_t *)calloc(1,0x10);
  p->vTiming = pVVar6;
  if (pVVar6 == (Vec_Flt_t *)0x0) {
    __assert_fail("p->vTiming != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x26b,"void Gia_ManTimeClean(Gia_Man_t *)");
  }
  iVar11 = p->nObjs;
  uVar10 = iVar11 * 3;
  if ((long)iVar11 < 1) {
    pVVar6->nSize = uVar10;
  }
  else {
    pfVar7 = (float *)calloc(1,(ulong)uVar10 * 4);
    pVVar6->pArray = pfVar7;
    pVVar6->nCap = uVar10;
    pVVar6->nSize = uVar10;
    lVar12 = 0;
    do {
      if ((ulong)uVar10 <= lVar12 + 1U) goto LAB_0022acaf;
      pfVar7[lVar12 + 1] = 1e+09;
      lVar12 = lVar12 + 3;
    } while ((long)iVar11 * 3 != lVar12);
  }
  Gia_ManLevelNum(p);
  if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
    Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
  }
  uVar10 = p->nObjs;
  if (0 < (int)uVar10) {
    lVar17 = 0;
    lVar12 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar5 = (uint)*(undefined8 *)(&pGVar2->field_0x0 + lVar17 * 4);
      if (((uVar5 & 0x9fffffff) == 0x9fffffff) || ((int)uVar5 < 0 && (~uVar5 & 0x1fffffff) != 0)) {
LAB_0022a830:
        fVar18 = Gia_ObjComputeArrival(p,(int)lVar12,1);
        uVar14 = *(undefined8 *)(&pGVar2->field_0x0 + lVar17 * 4);
        if ((((uint)uVar14 & 0x9fffffff) == 0x9fffffff) &&
           ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0)) {
          fVar18 = Tim_ManGetCiArrival((Tim_Man_t *)p->pManTime,
                                       (uint)((ulong)uVar14 >> 0x20) & 0x1fffffff);
          uVar14 = *(undefined8 *)(&pGVar2->field_0x0 + lVar17 * 4);
        }
        if (((~(uint)uVar14 & 0x1fffffff) != 0 && (int)(uint)uVar14 < 0) &&
           ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0)) {
          Tim_ManSetCoArrival((Tim_Man_t *)p->pManTime,(uint)((ulong)uVar14 >> 0x20) & 0x1fffffff,
                              fVar18);
        }
        if (p->vTiming->nSize <= (int)lVar17) goto LAB_0022acaf;
        p->vTiming->pArray[lVar17] = fVar18;
        uVar10 = p->nObjs;
      }
      else {
        if (p->vMapping->nSize <= lVar12) goto LAB_0022ad0c;
        if (p->vMapping->pArray[lVar12] != 0) goto LAB_0022a830;
      }
      lVar12 = lVar12 + 1;
      lVar17 = lVar17 + 3;
    } while (lVar12 < (int)uVar10);
  }
  pVVar8 = p->vCos;
  iVar11 = pVVar8->nSize;
  lVar12 = (long)iVar11;
  if (lVar12 < 1) {
    p_00 = (Tim_Man_t *)p->pManTime;
    local_34 = -1e+09;
    if (p_00 == (Tim_Man_t *)0x0) goto LAB_0022aa0e;
  }
  else {
    piVar3 = pVVar8->pArray;
    local_34 = -1e+09;
    lVar17 = 0;
    do {
      iVar4 = piVar3[lVar17];
      if (((long)iVar4 < 0) || ((int)uVar10 <= iVar4)) goto LAB_0022acce;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar9 = pGVar2 + iVar4 + -(ulong)((uint)*(undefined8 *)(pGVar2 + iVar4) & 0x1fffffff);
      if ((pGVar9 < pGVar2) || (pGVar2 + uVar10 <= pGVar9)) goto LAB_0022ad4a;
      uVar16 = (ulong)((long)pGVar9 - (long)pGVar2) >> 2;
      iVar15 = (int)uVar16;
      if (iVar15 * -0x55555555 < 0) goto LAB_0022aced;
      uVar5 = p->vTiming->nSize;
      if ((int)uVar5 <= iVar15) goto LAB_0022aced;
      uVar13 = iVar4 * 3;
      if (uVar5 == uVar13 || SBORROW4(uVar5,uVar13) != (int)(uVar5 + iVar4 * -3) < 0)
      goto LAB_0022acaf;
      pfVar7 = p->vTiming->pArray;
      fVar18 = pfVar7[uVar16 & 0xffffffff];
      pfVar7[uVar13] = fVar18;
      if (fVar18 <= local_34) {
        fVar18 = local_34;
      }
      local_34 = fVar18;
      lVar17 = lVar17 + 1;
    } while (lVar12 != lVar17);
    p_00 = (Tim_Man_t *)p->pManTime;
    if (p_00 == (Tim_Man_t *)0x0) {
      if (0 < iVar11) {
        piVar3 = pVVar8->pArray;
        lVar17 = 0;
        do {
          uVar5 = piVar3[lVar17];
          if (((int)uVar5 < 0) || ((int)uVar10 <= (int)uVar5)) goto LAB_0022acce;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (p->vTiming->nSize <= (int)(uVar5 * 3 + 1)) goto LAB_0022acaf;
          p->vTiming->pArray[(ulong)uVar5 * 3 + 1] = local_34;
          lVar17 = lVar17 + 1;
        } while (lVar12 != lVar17);
      }
      goto LAB_0022aa0e;
    }
  }
  Tim_ManIncrementTravId(p_00);
  Tim_ManInitPoRequiredAll((Tim_Man_t *)p->pManTime,local_34);
LAB_0022aa0e:
  pVVar8 = Gia_ManOrderReverse(p);
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      uVar10 = pVVar8->pArray[lVar12];
      uVar16 = (ulong)uVar10;
      if (((int)uVar10 < 0) || (p->nObjs <= (int)uVar10)) {
LAB_0022acce:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->vMapping->nSize <= (int)uVar10) {
LAB_0022ad0c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->vMapping->pArray[uVar16] == 0) {
        pGVar9 = p->pObjs;
        pGVar2 = pGVar9 + uVar16;
        uVar5 = (uint)*(undefined8 *)pGVar2;
        uVar13 = (uint)((ulong)*(undefined8 *)pGVar2 >> 0x20);
        if ((uVar5 & 0x9fffffff) == 0x9fffffff) {
          if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
            if (p->vTiming->nSize <= (int)(uVar10 * 3 + 1)) goto LAB_0022aced;
            Tim_ManSetCiRequired
                      ((Tim_Man_t *)p->pManTime,uVar13 & 0x1fffffff,
                       p->vTiming->pArray[uVar16 * 3 + 1]);
          }
        }
        else if ((~uVar5 & 0x1fffffff) != 0 && (int)uVar5 < 0) {
          if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
            fVar18 = Tim_ManGetCoRequired((Tim_Man_t *)p->pManTime,uVar13 & 0x1fffffff);
            if (p->vTiming->nSize <= (int)(uVar10 * 3 + 1)) {
LAB_0022acaf:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                            ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
            }
            p->vTiming->pArray[uVar16 * 3 + 1] = fVar18;
            pGVar9 = p->pObjs;
          }
          if ((pGVar2 < pGVar9) || (pGVar9 + p->nObjs <= pGVar2)) {
LAB_0022ad4a:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar11 = (int)((ulong)((long)pGVar2 - (long)pGVar9) >> 2) * -0x55555555 -
                   (*(uint *)pGVar2 & 0x1fffffff);
          if (iVar11 < 0) {
LAB_0022aced:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          uVar5 = iVar11 * 3 + 1;
          iVar11 = p->vTiming->nSize;
          if ((iVar11 <= (int)uVar5) || (uVar13 = uVar10 * 3 + 1, iVar11 <= (int)uVar13))
          goto LAB_0022aced;
          pfVar7 = p->vTiming->pArray;
          if (pfVar7[uVar13] < pfVar7[uVar5]) {
            pfVar7[uVar5] = pfVar7[uVar13];
          }
        }
      }
      else {
        Gia_ObjPropagateRequired(p,uVar10,1);
      }
      uVar13 = uVar10 * 3 + 1;
      uVar5 = p->vTiming->nSize;
      if ((int)uVar5 <= (int)uVar13) goto LAB_0022aced;
      pfVar7 = p->vTiming->pArray;
      fVar18 = pfVar7[uVar13] - pfVar7[uVar10 * 3];
      if (fVar18 + 0.01 <= 0.0) {
        __assert_fail("tSlack + 0.01 > 0.0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSpeedup.c"
                      ,0x13e,"float Gia_ManDelayTraceLut(Gia_Man_t *)");
      }
      uVar10 = uVar10 * 3 + 2;
      if (uVar5 <= uVar10) goto LAB_0022acaf;
      fVar19 = 0.0;
      if (0.0 <= fVar18) {
        fVar19 = fVar18;
      }
      pfVar7[uVar10] = fVar19;
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar8->nSize);
  }
  if (pVVar8->pArray != (int *)0x0) {
    free(pVVar8->pArray);
  }
  free(pVVar8);
  return local_34;
}

Assistant:

float Gia_ManDelayTraceLut( Gia_Man_t * p )
{
    int fUseSorting = 1;
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    Vec_Int_t * vObjs;
    Gia_Obj_t * pObj;
    float tArrival, tArrivalCur, tRequired, tSlack;
    int i, iObj;

    // get the library
    if ( pLutLib && pLutLib->LutMax < Gia_ManLutSizeMax(p) )
    {
        printf( "The max LUT size (%d) is less than the max fanin count (%d).\n", 
            pLutLib->LutMax, Gia_ManLutSizeMax(p) );
        return -TIM_ETERNITY;
    }

    // initialize the arrival times
    Gia_ManTimeStart( p );
    Gia_ManLevelNum( p );

    // propagate arrival times
    if ( p->pManTime )
        Tim_ManIncrementTravId( (Tim_Man_t *)p->pManTime );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( !Gia_ObjIsCi(pObj) && !Gia_ObjIsCo(pObj) && !Gia_ObjIsLut(p, i) )
            continue;
        tArrival = Gia_ObjComputeArrival( p, i, fUseSorting );
        if ( Gia_ObjIsCi(pObj) && p->pManTime )
        {
            tArrival = Tim_ManGetCiArrival( (Tim_Man_t *)p->pManTime, Gia_ObjCioId(pObj) );
//printf( "%.3f  ", tArrival );
        }
        if ( Gia_ObjIsCo(pObj) && p->pManTime )
            Tim_ManSetCoArrival( (Tim_Man_t *)p->pManTime, Gia_ObjCioId(pObj), tArrival );
        Gia_ObjSetTimeArrival( p, i, tArrival );
    }

    // get the latest arrival times
    tArrival = -TIM_ETERNITY;
    Gia_ManForEachCo( p, pObj, i )
    {
        tArrivalCur = Gia_ObjTimeArrivalObj( p, Gia_ObjFanin0(pObj) );
        Gia_ObjSetTimeArrival( p, Gia_ObjId(p,pObj), tArrivalCur );
        if ( tArrival < tArrivalCur )
            tArrival = tArrivalCur;
    }

    // initialize the required times
    if ( p->pManTime )
    {
        Tim_ManIncrementTravId( (Tim_Man_t *)p->pManTime );
        Tim_ManInitPoRequiredAll( (Tim_Man_t *)p->pManTime, tArrival );
    }
    else
    {
        Gia_ManForEachCo( p, pObj, i )
            Gia_ObjSetTimeRequiredObj( p, pObj, tArrival );
    }

    // propagate the required times
    vObjs = Gia_ManOrderReverse( p );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        pObj = Gia_ManObj(p, iObj);
        if ( Gia_ObjIsLut(p, iObj) )
        {
            Gia_ObjPropagateRequired( p, iObj, fUseSorting );
        }
        else if ( Gia_ObjIsCi(pObj) )
        {
            if ( p->pManTime )
                Tim_ManSetCiRequired( (Tim_Man_t *)p->pManTime, Gia_ObjCioId(pObj), Gia_ObjTimeRequired(p, iObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            if ( p->pManTime )
            {
                tRequired = Tim_ManGetCoRequired( (Tim_Man_t *)p->pManTime, Gia_ObjCioId(pObj) );
                Gia_ObjSetTimeRequired( p, iObj, tRequired );
            }
            if ( Gia_ObjTimeRequired(p, Gia_ObjFaninId0p(p, pObj)) > Gia_ObjTimeRequired(p, iObj) )
                Gia_ObjSetTimeRequired(p, Gia_ObjFaninId0p(p, pObj), Gia_ObjTimeRequired(p, iObj) );
        }

        // set slack for this object
        tSlack = Gia_ObjTimeRequired(p, iObj) - Gia_ObjTimeArrival(p, iObj);
        assert( tSlack + 0.01 > 0.0 );
        Gia_ObjSetTimeSlack( p, iObj, tSlack < 0.0 ? 0.0 : tSlack );
    }
    Vec_IntFree( vObjs );
    return tArrival;
}